

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O3

USTATUS __thiscall
FfsParser::parseBpdtRegion
          (FfsParser *this,UByteArray *region,UINT32 localOffset,UINT32 sbpdtOffsetFixup,
          UModelIndex *parent,UModelIndex *index)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uchar **ppuVar2;
  UINT32 UVar3;
  UINT32 UVar4;
  pointer pcVar5;
  TreeModel *pTVar6;
  pointer pBVar7;
  UINT8 UVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  int iVar15;
  char *pcVar16;
  uint uVar17;
  uint *puVar18;
  USTATUS UVar19;
  uint uVar20;
  BPDT_PARTITION_INFO_ *pBVar21;
  vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_> local_2d8;
  FfsParser *local_2c0;
  undefined1 local_2b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  TreeModel *pTStack_298;
  UByteArray signature;
  UModelIndex entryIndex;
  UByteArray partition;
  CBString local_200;
  UModelIndex *local_1e0;
  ulong local_1d8;
  UINT32 local_1cc;
  CBString info;
  CBString name;
  UModelIndex partitionIndex;
  CBString name_1;
  CBString text;
  CBString info_1;
  CBString local_138;
  CBString local_120;
  long local_108;
  CBString local_100;
  CBString local_e8;
  UByteArray header;
  CBString local_b0;
  CBString local_98;
  CBString local_80;
  UByteArray body;
  CBString local_48;
  
  uVar9 = (region->d)._M_string_length;
  uVar20 = (uint)uVar9;
  local_1cc = sbpdtOffsetFixup;
  if (uVar20 < 0x18) {
    usprintf((CBString *)local_2b8,"%s: BPDT region too small to fit BPDT partition table header",
             "parseBpdtRegion");
    msg(this,(CBString *)local_2b8,parent);
LAB_0012b61b:
    Bstrlib::CBString::~CBString((CBString *)local_2b8);
    return 0xfd;
  }
  pcVar5 = (region->d)._M_dataplus._M_p;
  uVar11 = (uint)*(ushort *)(pcVar5 + 4) * 0xc + 0x18;
  if (uVar20 < uVar11) {
    usprintf((CBString *)local_2b8,"%s: BPDT region too small to fit BPDT partition table",
             "parseBpdtRegion");
    msg(this,(CBString *)local_2b8,parent);
    goto LAB_0012b61b;
  }
  uVar12 = (uint)*(ushort *)(pcVar5 + 4) * 0xc;
  local_2c0 = this;
  UByteArray::left(&header,region,0x18);
  UByteArray::mid(&body,region,0x18,uVar12);
  local_1e0 = parent;
  Bstrlib::CBString::CBString(&name,"BPDT partition table");
  local_1d8 = (ulong)(byte)pcVar5[6];
  usprintf(&info,
           "Full size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nNumber of entries: %u\nVersion: %02Xh\nRedundancyFlag: %Xh\nIFWI version: %Xh\nFITC version: %u.%u.%u.%u"
           ,(ulong)uVar11,(ulong)uVar11,(ulong)(uint)header.d._M_string_length,
           (ulong)(uint)header.d._M_string_length,(ulong)uVar12,(ulong)uVar12,
           (ulong)*(ushort *)(pcVar5 + 4),local_1d8,(ulong)(byte)pcVar5[7],
           (ulong)*(uint *)(pcVar5 + 0xc),(ulong)*(ushort *)(pcVar5 + 0x10),
           (ulong)*(ushort *)(pcVar5 + 0x12),(ulong)*(ushort *)(pcVar5 + 0x14),
           (ulong)*(ushort *)(pcVar5 + 0x16));
  pTVar6 = local_2c0->model;
  Bstrlib::CBString::CBString((CBString *)&signature);
  local_2b8._8_8_ = 0;
  local_2a8._M_allocated_capacity = local_2a8._M_allocated_capacity & 0xffffffffffffff00;
  local_2b8._0_8_ = local_2b8 + 0x10;
  TreeModel::addItem((UModelIndex *)&partition,pTVar6,localOffset,'\\','\0',&name,
                     (CBString *)&signature,&info,&header,&body,(UByteArray *)local_2b8,Fixed,
                     local_1e0,'\0');
  index->m = (TreeModel *)partition.d.field_2._M_allocated_capacity;
  *(pointer *)index = partition.d._M_dataplus._M_p;
  index->i = CONCAT44(partition.d._M_string_length._4_4_,(uint)partition.d._M_string_length);
  if ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10) {
    operator_delete((void *)local_2b8._0_8_);
  }
  Bstrlib::CBString::~CBString((CBString *)&signature);
  local_2d8.super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>._M_impl.
  super__Vector_impl_data._M_start = (BPDT_PARTITION_INFO_ *)0x0;
  local_2d8.super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>._M_impl.
  super__Vector_impl_data._M_finish = (BPDT_PARTITION_INFO_ *)0x0;
  local_2d8.super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (BPDT_PARTITION_INFO_ *)0x0;
  if (*(ushort *)(pcVar5 + 4) == 0) {
    uVar12 = 0x18;
  }
  else {
    local_108 = (ulong)*(ushort *)(pcVar5 + 4) * 0xc;
    local_1d8 = (ulong)(localOffset + 0x18);
    lVar14 = 0;
    puVar18 = (uint *)(pcVar5 + 0x18);
    do {
      bpdtEntryTypeToUString((CBString *)local_2b8,(UINT16)*puVar18);
      Bstrlib::CBString::operator=(&name,(CBString *)local_2b8);
      Bstrlib::CBString::~CBString((CBString *)local_2b8);
      usprintf((CBString *)&partitionIndex,
               "Full size: %Xh (%u)\nType: %Xh\nPartition offset: %Xh\nPartition length: %Xh",0xc,
               0xc,(ulong)(ushort)*puVar18,(ulong)puVar18[1],(ulong)puVar18[2]);
      Bstrlib::CBString::CBString(&local_e8,"\nSplit sub-partition first part: ");
      Bstrlib::CBString::operator+(&text,(CBString *)&partitionIndex,&local_e8);
      pcVar16 = "Yes";
      if ((*puVar18 >> 0x10 & 1) == 0) {
        pcVar16 = "No";
      }
      Bstrlib::CBString::operator+(&info_1,&text,pcVar16);
      Bstrlib::CBString::CBString(&local_120,"\nSplit sub-partition second part: ");
      Bstrlib::CBString::operator+(&name_1,&info_1,&local_120);
      pcVar16 = "Yes";
      if ((*puVar18 >> 0x11 & 1) == 0) {
        pcVar16 = "No";
      }
      Bstrlib::CBString::operator+(&local_200,&name_1,pcVar16);
      Bstrlib::CBString::CBString(&local_100,"\nCode sub-partition: ");
      Bstrlib::CBString::operator+((CBString *)&entryIndex,&local_200,&local_100);
      pcVar16 = "Yes";
      if ((*puVar18 >> 0x12 & 1) == 0) {
        pcVar16 = "No";
      }
      Bstrlib::CBString::operator+((CBString *)&signature,(CBString *)&entryIndex,pcVar16);
      Bstrlib::CBString::CBString(&local_138,"\nUMA cacheable: ");
      Bstrlib::CBString::operator+((CBString *)&partition,(CBString *)&signature,&local_138);
      pcVar16 = "Yes";
      if ((*puVar18 >> 0x13 & 1) == 0) {
        pcVar16 = "No";
      }
      Bstrlib::CBString::operator+((CBString *)local_2b8,(CBString *)&partition,pcVar16);
      Bstrlib::CBString::operator=(&info,(CBString *)local_2b8);
      Bstrlib::CBString::~CBString((CBString *)local_2b8);
      Bstrlib::CBString::~CBString((CBString *)&partition);
      Bstrlib::CBString::~CBString(&local_138);
      Bstrlib::CBString::~CBString((CBString *)&signature);
      Bstrlib::CBString::~CBString((CBString *)&entryIndex);
      Bstrlib::CBString::~CBString(&local_100);
      Bstrlib::CBString::~CBString(&local_200);
      Bstrlib::CBString::~CBString(&name_1);
      Bstrlib::CBString::~CBString(&local_120);
      Bstrlib::CBString::~CBString(&info_1);
      Bstrlib::CBString::~CBString(&text);
      Bstrlib::CBString::~CBString(&local_e8);
      Bstrlib::CBString::~CBString((CBString *)&partitionIndex);
      pTVar6 = local_2c0->model;
      Bstrlib::CBString::CBString(&local_200);
      local_2b8._0_8_ = local_2b8 + 0x10;
      local_2b8._8_8_ = 0;
      local_2a8._M_allocated_capacity = local_2a8._M_allocated_capacity & 0xffffffffffffff00;
      partition.d._M_dataplus._M_p = (pointer)&partition.d.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&partition,puVar18);
      iVar15 = (int)lVar14;
      paVar1 = &signature.d.field_2;
      signature.d._M_string_length = 0;
      signature.d.field_2._M_local_buf[0] = '\0';
      signature.d._M_dataplus._M_p = (pointer)paVar1;
      TreeModel::addItem(&entryIndex,pTVar6,(int)local_1d8 + iVar15,']','\0',&name,&local_200,&info,
                         (UByteArray *)local_2b8,&partition,&signature,Fixed,index,'\0');
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)signature.d._M_dataplus._M_p != paVar1) {
        operator_delete(signature.d._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)partition.d._M_dataplus._M_p != &partition.d.field_2) {
        operator_delete(partition.d._M_dataplus._M_p);
      }
      if ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10) {
        operator_delete((void *)local_2b8._0_8_);
      }
      Bstrlib::CBString::~CBString(&local_200);
      if ((1 < puVar18[1] + 1) && (puVar18[2] != 0)) {
        local_2b8[0xc] = 0x5e;
        local_2b8._8_4_ = puVar18[2];
        local_2b8._13_3_ = 0;
        local_2b8._4_4_ = (undefined4)((ulong)*(undefined8 *)puVar18 >> 0x20);
        local_2b8._0_4_ = (undefined4)*(undefined8 *)puVar18;
        local_2b8._4_4_ = local_2b8._4_4_ - local_1cc;
        pTStack_298 = entryIndex.m;
        local_2a8._8_8_ = entryIndex.i;
        local_2a8._M_allocated_capacity._0_4_ = entryIndex.r;
        local_2a8._M_allocated_capacity._4_4_ = entryIndex.c;
        if (local_2d8.
            super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_2d8.
            super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<BPDT_PARTITION_INFO_,std::allocator<BPDT_PARTITION_INFO_>>::
          _M_realloc_insert<BPDT_PARTITION_INFO_const&>
                    ((vector<BPDT_PARTITION_INFO_,std::allocator<BPDT_PARTITION_INFO_>> *)&local_2d8
                     ,(iterator)
                      local_2d8.
                      super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                      ._M_impl.super__Vector_impl_data._M_finish,(BPDT_PARTITION_INFO_ *)local_2b8);
        }
        else {
          ((local_2d8.
            super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>._M_impl.
            super__Vector_impl_data._M_finish)->index).m = entryIndex.m;
          ((local_2d8.
            super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>._M_impl.
            super__Vector_impl_data._M_finish)->index).r = entryIndex.r;
          ((local_2d8.
            super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>._M_impl.
            super__Vector_impl_data._M_finish)->index).c = entryIndex.c;
          ((local_2d8.
            super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>._M_impl.
            super__Vector_impl_data._M_finish)->index).i = entryIndex.i;
          *(undefined8 *)
           &(local_2d8.
             super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>._M_impl
             .super__Vector_impl_data._M_finish)->ptEntry = local_2b8._0_8_;
          *(undefined8 *)
           &((local_2d8.
              super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
              _M_impl.super__Vector_impl_data._M_finish)->ptEntry).Size = local_2b8._8_8_;
          local_2d8.super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_2d8.
               super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
          local_2a8._M_allocated_capacity = (size_type)(uchar *)entryIndex._0_8_;
        }
      }
      lVar14 = lVar14 + 0xc;
      puVar18 = puVar18 + 3;
    } while (local_108 != lVar14);
    if (local_2d8.super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_2d8.super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
        _M_impl.super__Vector_impl_data._M_finish) goto LAB_0012bd1d;
    uVar12 = iVar15 + 0x24;
  }
  local_2a8._M_allocated_capacity = 0xffffffffffffffff;
  local_2a8._8_8_ = 0;
  pTStack_298 = (TreeModel *)0x0;
  local_2b8._0_8_ = (ulong)uVar12 << 0x20;
  local_2b8[0xc] = 0x40;
  local_2b8._8_4_ = (int)(region->d)._M_string_length - uVar12;
  local_2b8._13_3_ = 0;
  if (local_2d8.super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      local_2d8.super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<BPDT_PARTITION_INFO_,std::allocator<BPDT_PARTITION_INFO_>>::
    _M_realloc_insert<BPDT_PARTITION_INFO_const&>
              ((vector<BPDT_PARTITION_INFO_,std::allocator<BPDT_PARTITION_INFO_>> *)&local_2d8,
               (iterator)
               local_2d8.
               super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
               _M_impl.super__Vector_impl_data._M_finish,(BPDT_PARTITION_INFO_ *)local_2b8);
  }
  else {
    ((local_2d8.super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
      _M_impl.super__Vector_impl_data._M_finish)->index).m = (TreeModel *)0x0;
    ((local_2d8.super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
      _M_impl.super__Vector_impl_data._M_finish)->index).r = -1;
    ((local_2d8.super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
      _M_impl.super__Vector_impl_data._M_finish)->index).c = -1;
    ((local_2d8.super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
      _M_impl.super__Vector_impl_data._M_finish)->index).i = 0;
    *(undefined8 *)
     &(local_2d8.super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
       _M_impl.super__Vector_impl_data._M_finish)->ptEntry = local_2b8._0_8_;
    *(undefined8 *)
     &((local_2d8.super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
        _M_impl.super__Vector_impl_data._M_finish)->ptEntry).Size = local_2b8._8_8_;
    local_2d8.super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_2d8.super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
LAB_0012bd1d:
  UVar19 = 0xfd;
  pBVar21 = local_2d8.
            super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (local_2d8.super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_2d8.super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    uVar9 = uVar9 & 0xffffffff;
    do {
      pBVar7 = local_2d8.
               super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar10 = ((long)local_2d8.
                      super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_2d8.
                      super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
      lVar14 = 0x3f;
      if (uVar10 != 0) {
        for (; uVar10 >> lVar14 == 0; lVar14 = lVar14 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<BPDT_PARTITION_INFO_*,std::vector<BPDT_PARTITION_INFO_,std::allocator<BPDT_PARTITION_INFO_>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_2d8.
                 super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 local_2d8.
                 super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
                 _M_impl.super__Vector_impl_data._M_finish,((uint)lVar14 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<BPDT_PARTITION_INFO_*,std::vector<BPDT_PARTITION_INFO_,std::allocator<BPDT_PARTITION_INFO_>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pBVar7);
      local_2b8._0_8_ = (_func_int **)0x0;
      local_2b8._8_8_ = 0;
      local_2a8._M_allocated_capacity = 0xffffffffffffffff;
      local_2a8._8_8_ = 0;
      pTStack_298 = (TreeModel *)0x0;
      uVar12 = ((local_2d8.
                 super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
                 _M_impl.super__Vector_impl_data._M_start)->ptEntry).Offset;
      if (uVar12 < uVar11) {
        usprintf((CBString *)&partition,
                 "%s: BPDT partition has intersection with BPDT partition table, skipped",
                 "parseBpdtRegion");
        msg(local_2c0,(CBString *)&partition,
            &(local_2d8.
              super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
              _M_impl.super__Vector_impl_data._M_start)->index);
        Bstrlib::CBString::~CBString((CBString *)&partition);
        pBVar21 = local_2d8.
                  super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
                  _M_impl.super__Vector_impl_data._M_start + 1;
        if (pBVar21 !=
            local_2d8.
            super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          memmove(local_2d8.
                  super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
                  _M_impl.super__Vector_impl_data._M_start,pBVar21,
                  (long)local_2d8.
                        super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar21);
        }
      }
      else {
        if (uVar11 < uVar12) {
          local_2b8._0_8_ = (ulong)uVar11 << 0x20;
          local_2b8[0xc] = 0x40;
          local_2b8._8_4_ =
               ((local_2d8.
                 super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
                 _M_impl.super__Vector_impl_data._M_start)->ptEntry).Offset - uVar11;
          local_2b8._13_3_ = 0;
          std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::insert
                    (&local_2d8,
                     (const_iterator)
                     local_2d8.
                     super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                     ._M_impl.super__Vector_impl_data._M_start,(value_type *)local_2b8);
        }
        pBVar21 = local_2d8.
                  super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if ((ulong)(((long)local_2d8.
                           super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_2d8.
                           super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333) <
            2) {
LAB_0012c052:
          if (local_2d8.
              super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
              _M_impl.super__Vector_impl_data._M_finish != pBVar21) {
            lVar14 = 0;
            uVar10 = 0;
            do {
              if ((&pBVar21->type)[lVar14] == '@') {
                UByteArray::mid(&partition,region,
                                *(int32_t *)((long)&(pBVar21->ptEntry).Offset + lVar14),
                                *(int32_t *)((long)&(pBVar21->ptEntry).Size + lVar14));
                Bstrlib::CBString::CBString((CBString *)&signature,"Padding");
                Bstrlib::CBString::operator=(&name,(CBString *)&signature);
                Bstrlib::CBString::~CBString((CBString *)&signature);
                usprintf((CBString *)&signature,"Full size: %Xh (%u)",
                         (ulong)(uint)partition.d._M_string_length);
                Bstrlib::CBString::operator=(&info,(CBString *)&signature);
                Bstrlib::CBString::~CBString((CBString *)&signature);
                pTVar6 = local_2c0->model;
                iVar15 = *(int *)((long)&((local_2d8.
                                           super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->ptEntry).
                                         Offset + lVar14);
                UVar8 = getPaddingType(&partition);
                Bstrlib::CBString::CBString(&local_200);
                signature.d._M_dataplus._M_p = (pointer)&signature.d.field_2;
                signature.d._M_string_length = 0;
                signature.d.field_2._M_local_buf[0] = '\0';
                entryIndex.i = 0;
                entryIndex.m = (TreeModel *)((ulong)entryIndex.m & 0xffffffffffffff00);
                entryIndex._0_8_ = &entryIndex.m;
                TreeModel::addItem((UModelIndex *)&name_1,pTVar6,iVar15 + localOffset,'@',UVar8,
                                   &name,&local_200,&info,&signature,&partition,
                                   (UByteArray *)&entryIndex,Fixed,local_1e0,'\0');
                if ((TreeModel **)entryIndex._0_8_ != &entryIndex.m) {
                  operator_delete((void *)entryIndex._0_8_);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)signature.d._M_dataplus._M_p != &signature.d.field_2) {
                  operator_delete(signature.d._M_dataplus._M_p);
                }
                Bstrlib::CBString::~CBString(&local_200);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)partition.d._M_dataplus._M_p != &partition.d.field_2) {
                  operator_delete(partition.d._M_dataplus._M_p);
                }
              }
              else if ((&pBVar21->type)[lVar14] == '^') {
                bpdtEntryTypeToUString
                          (&name_1,*(UINT16 *)((long)&(pBVar21->ptEntry).field_0x0 + lVar14));
                UByteArray::mid(&partition,region,
                                *(int32_t *)
                                 ((long)&((local_2d8.
                                           super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->ptEntry).
                                         Offset + lVar14),
                                *(int32_t *)
                                 ((long)&((local_2d8.
                                           super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->ptEntry).Size
                                 + lVar14));
                UByteArray::left(&signature,&partition,4);
                usprintf(&local_138,"Full size: %Xh (%u)\nType: %Xh",
                         (ulong)(uint)partition.d._M_string_length);
                Bstrlib::CBString::CBString(&local_80,"\nSplit sub-partition first part: ");
                Bstrlib::CBString::operator+(&local_100,&local_138,&local_80);
                pcVar16 = "Yes";
                if ((*(uint *)((long)&((local_2d8.
                                        super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->ptEntry).
                                      field_0x0 + lVar14) >> 0x10 & 1) == 0) {
                  pcVar16 = "No";
                }
                Bstrlib::CBString::operator+(&local_120,&local_100,pcVar16);
                Bstrlib::CBString::CBString(&local_98,"\nSplit sub-partition second part: ");
                Bstrlib::CBString::operator+(&local_e8,&local_120,&local_98);
                pcVar16 = "Yes";
                if ((*(uint *)((long)&((local_2d8.
                                        super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->ptEntry).
                                      field_0x0 + lVar14) >> 0x11 & 1) == 0) {
                  pcVar16 = "No";
                }
                Bstrlib::CBString::operator+((CBString *)&partitionIndex,&local_e8,pcVar16);
                Bstrlib::CBString::CBString(&local_b0,"\nCode sub-partition: ");
                Bstrlib::CBString::operator+(&text,(CBString *)&partitionIndex,&local_b0);
                pcVar16 = "Yes";
                if ((*(uint *)((long)&((local_2d8.
                                        super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->ptEntry).
                                      field_0x0 + lVar14) >> 0x12 & 1) == 0) {
                  pcVar16 = "No";
                }
                Bstrlib::CBString::operator+(&local_200,&text,pcVar16);
                Bstrlib::CBString::CBString(&local_48,"\nUMA cacheable: ");
                Bstrlib::CBString::operator+((CBString *)&entryIndex,&local_200,&local_48);
                pcVar16 = "Yes";
                if ((*(uint *)((long)&((local_2d8.
                                        super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->ptEntry).
                                      field_0x0 + lVar14) >> 0x13 & 1) == 0) {
                  pcVar16 = "No";
                }
                Bstrlib::CBString::operator+(&info_1,(CBString *)&entryIndex,pcVar16);
                Bstrlib::CBString::~CBString((CBString *)&entryIndex);
                Bstrlib::CBString::~CBString(&local_48);
                Bstrlib::CBString::~CBString(&local_200);
                Bstrlib::CBString::~CBString(&text);
                Bstrlib::CBString::~CBString(&local_b0);
                Bstrlib::CBString::~CBString((CBString *)&partitionIndex);
                Bstrlib::CBString::~CBString(&local_e8);
                Bstrlib::CBString::~CBString(&local_98);
                Bstrlib::CBString::~CBString(&local_120);
                Bstrlib::CBString::~CBString(&local_100);
                Bstrlib::CBString::~CBString(&local_80);
                Bstrlib::CBString::~CBString(&local_138);
                bpdtEntryTypeToUString
                          (&text,*(UINT16 *)
                                  ((long)&((local_2d8.
                                            super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->ptEntry).
                                          field_0x0 + lVar14));
                entryIndex._0_8_ = &entryIndex.m;
                entryIndex.i = 0;
                entryIndex.m = (TreeModel *)((ulong)entryIndex.m & 0xffffffffffffff00);
                ppuVar2 = &local_200.super_tagbstring.data;
                local_200.super_tagbstring.mlen = 0;
                local_200.super_tagbstring.slen = 0;
                local_200.super_tagbstring.data._0_1_ = 0;
                local_200._vptr_CBString = (_func_int **)ppuVar2;
                TreeModel::addItem(&partitionIndex,local_2c0->model,
                                   *(int *)((long)&((local_2d8.
                                                                                                          
                                                  super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  ptEntry).Offset + lVar14) + localOffset,'^','\0',
                                   &name_1,&text,&info_1,(UByteArray *)&entryIndex,&partition,
                                   (UByteArray *)&local_200,Fixed,local_1e0,'\0');
                if (local_200._vptr_CBString != (_func_int **)ppuVar2) {
                  operator_delete(local_200._vptr_CBString);
                }
                if ((TreeModel **)entryIndex._0_8_ != &entryIndex.m) {
                  operator_delete((void *)entryIndex._0_8_);
                }
                if (*(short *)((long)&((local_2d8.
                                        super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->ptEntry).
                                      field_0x0 + lVar14) == 5) {
                  entryIndex.r = -1;
                  entryIndex.c = -1;
                  entryIndex.i = 0;
                  entryIndex.m = (TreeModel *)0x0;
                  parseBpdtRegion(local_2c0,&partition,0,
                                  *(UINT32 *)
                                   ((long)&((local_2d8.
                                             super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->ptEntry).
                                           Offset + lVar14),&partitionIndex,&entryIndex);
                }
                if (*(int *)partition.d._M_dataplus._M_p == 0x44504324) {
                  entryIndex.r = -1;
                  entryIndex.c = -1;
                  entryIndex.i = 0;
                  entryIndex.m = (TreeModel *)0x0;
                  parseCpdRegion(local_2c0,&partition,0,&partitionIndex,&entryIndex);
                }
                if (0x2d < (*(uint *)((long)&((local_2d8.
                                               super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->ptEntry).
                                             field_0x0 + lVar14) & 0xfffe)) {
                  usprintf((CBString *)&entryIndex,"%s: BPDT entry of unknown type found",
                           "parseBpdtRegion");
                  msg(local_2c0,(CBString *)&entryIndex,&partitionIndex);
                  Bstrlib::CBString::~CBString((CBString *)&entryIndex);
                }
                Bstrlib::CBString::~CBString(&text);
                Bstrlib::CBString::~CBString(&info_1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)signature.d._M_dataplus._M_p != &signature.d.field_2) {
                  operator_delete(signature.d._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)partition.d._M_dataplus._M_p != &partition.d.field_2) {
                  operator_delete(partition.d._M_dataplus._M_p);
                }
                Bstrlib::CBString::~CBString(&name_1);
              }
              uVar10 = uVar10 + 1;
              lVar14 = lVar14 + 0x28;
              pBVar21 = local_2d8.
                        super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            } while (uVar10 < (ulong)(((long)local_2d8.
                                             super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_2d8.
                                             super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                             ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                     -0x3333333333333333));
          }
          uVar11 = local_2d8.
                   super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
                   _M_impl.super__Vector_impl_data._M_finish[-1].ptEntry.Offset;
          uVar12 = local_2d8.
                   super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
                   _M_impl.super__Vector_impl_data._M_finish[-1].ptEntry.Size;
          if ((ulong)uVar12 + (ulong)uVar11 < uVar9) {
            iVar15 = uVar12 + uVar11;
            UByteArray::mid(&partition,region,iVar15,uVar20 - iVar15);
            Bstrlib::CBString::CBString((CBString *)&signature,"Padding");
            Bstrlib::CBString::operator=(&name,(CBString *)&signature);
            Bstrlib::CBString::~CBString((CBString *)&signature);
            usprintf((CBString *)&signature,"Full size: %Xh (%u)",
                     (ulong)(uint)partition.d._M_string_length);
            Bstrlib::CBString::operator=(&info,(CBString *)&signature);
            Bstrlib::CBString::~CBString((CBString *)&signature);
            pTVar6 = local_2c0->model;
            UVar3 = local_2d8.
                    super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
                    _M_impl.super__Vector_impl_data._M_finish[-1].ptEntry.Offset;
            UVar4 = local_2d8.
                    super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
                    _M_impl.super__Vector_impl_data._M_finish[-1].ptEntry.Size;
            UVar8 = getPaddingType(&partition);
            Bstrlib::CBString::CBString(&local_200);
            paVar1 = &signature.d.field_2;
            signature.d._M_string_length = 0;
            signature.d.field_2._M_local_buf[0] = '\0';
            entryIndex.i = 0;
            entryIndex.m = (TreeModel *)((ulong)entryIndex.m & 0xffffffffffffff00);
            signature.d._M_dataplus._M_p = (pointer)paVar1;
            entryIndex._0_8_ = &entryIndex.m;
            TreeModel::addItem((UModelIndex *)&name_1,pTVar6,localOffset + UVar3 + UVar4,'@',UVar8,
                               &name,&local_200,&info,&signature,&partition,
                               (UByteArray *)&entryIndex,Fixed,local_1e0,'\0');
            if ((TreeModel **)entryIndex._0_8_ != &entryIndex.m) {
              operator_delete((void *)entryIndex._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)signature.d._M_dataplus._M_p != paVar1) {
              operator_delete(signature.d._M_dataplus._M_p);
            }
            Bstrlib::CBString::~CBString(&local_200);
            pBVar21 = local_2d8.
                      super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)partition.d._M_dataplus._M_p != &partition.d.field_2) {
              operator_delete(partition.d._M_dataplus._M_p);
              pBVar21 = local_2d8.
                        super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            }
          }
          UVar19 = 0;
          break;
        }
        uVar10 = 1;
        lVar14 = 0;
        while( true ) {
          uVar12 = *(uint *)((long)&pBVar21[1].ptEntry.Offset + lVar14);
          uVar17 = *(int *)((long)&(pBVar21->ptEntry).Size + lVar14) +
                   *(int *)((long)&(pBVar21->ptEntry).Offset + lVar14);
          uVar13 = *(uint *)((long)&pBVar21[1].ptEntry.Size + lVar14);
          if (uVar9 < (ulong)uVar13 + (ulong)uVar12) {
            if ((ulong)(long)(int)(region->d)._M_string_length <= (ulong)uVar12) {
              usprintf((CBString *)&partition,
                       "%s: BPDT partition is located outside of the opened image, skipped",
                       "parseBpdtRegion");
              msg(local_2c0,(CBString *)&partition,
                  (UModelIndex *)
                  ((long)&local_2d8.
                          super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].index.r + lVar14));
              goto LAB_0012bfee;
            }
            usprintf((CBString *)&partition,
                     "%s: BPDT partition can\'t fit into its region, truncated","parseBpdtRegion");
            msg(local_2c0,(CBString *)&partition,
                (UModelIndex *)
                ((long)&local_2d8.
                        super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1].index.r + lVar14));
            Bstrlib::CBString::~CBString((CBString *)&partition);
            uVar12 = *(uint *)((long)&local_2d8.
                                      super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[1].ptEntry.Offset +
                              lVar14);
            uVar13 = uVar20 - uVar12;
            *(uint *)((long)&local_2d8.
                             super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                             ._M_impl.super__Vector_impl_data._M_start[1].ptEntry.Size + lVar14) =
                 uVar13;
            pBVar21 = local_2d8.
                      super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          }
          if (uVar12 < uVar17) break;
          if (uVar17 < uVar12) {
            local_2b8._4_4_ = uVar17;
            local_2b8[0xc] = 0x40;
            local_2b8._8_4_ = *(int *)((long)&pBVar21[1].ptEntry.Offset + lVar14) - uVar17;
            std::vector<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>::insert
                      (&local_2d8,(BPDT_PARTITION_INFO_ *)(&pBVar21[1].ptEntry.field_0x0 + lVar14),
                       (value_type *)local_2b8);
            pBVar21 = local_2d8.
                      super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          }
          uVar10 = uVar10 + 1;
          lVar14 = lVar14 + 0x28;
          if ((ulong)(((long)local_2d8.
                             super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar21 >> 3) *
                     -0x3333333333333333) <= uVar10) goto LAB_0012c052;
        }
        if (uVar17 < uVar13 + uVar12) {
          usprintf((CBString *)&partition,"%s: BPDT partition intersects with previous one, skipped"
                   ,"parseBpdtRegion");
          msg(local_2c0,(CBString *)&partition,
              (UModelIndex *)
              ((long)&local_2d8.
                      super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                      ._M_impl.super__Vector_impl_data._M_start[1].index.r + lVar14));
        }
        else {
          usprintf((CBString *)&partition,
                   "%s: BPDT partition is located inside another BPDT partition, skipped",
                   "parseBpdtRegion");
          msg(local_2c0,(CBString *)&partition,
              (UModelIndex *)
              ((long)&local_2d8.
                      super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                      ._M_impl.super__Vector_impl_data._M_start[1].index.r + lVar14));
        }
LAB_0012bfee:
        Bstrlib::CBString::~CBString((CBString *)&partition);
        pBVar21 = (BPDT_PARTITION_INFO_ *)
                  (&local_2d8.
                    super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
                    _M_impl.super__Vector_impl_data._M_start[2].ptEntry.field_0x0 + lVar14);
        if (pBVar21 !=
            local_2d8.
            super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          memmove(&local_2d8.
                   super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
                   _M_impl.super__Vector_impl_data._M_start[1].ptEntry.field_0x0 + lVar14,pBVar21,
                  (long)local_2d8.
                        super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                        ._M_impl.super__Vector_impl_data._M_finish +
                  (-lVar14 -
                  (long)local_2d8.
                        super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
                        ._M_impl.super__Vector_impl_data._M_start) + -0x50);
        }
      }
      local_2d8.super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_2d8.super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
      pBVar21 = local_2d8.
                super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (local_2d8.
             super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>._M_impl
             .super__Vector_impl_data._M_start !=
             local_2d8.
             super__Vector_base<BPDT_PARTITION_INFO_,_std::allocator<BPDT_PARTITION_INFO_>_>._M_impl
             .super__Vector_impl_data._M_finish);
  }
  if (pBVar21 != (BPDT_PARTITION_INFO_ *)0x0) {
    operator_delete(pBVar21);
  }
  Bstrlib::CBString::~CBString(&info);
  Bstrlib::CBString::~CBString(&name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)body.d._M_dataplus._M_p != &body.d.field_2) {
    operator_delete(body.d._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)header.d._M_dataplus._M_p == &header.d.field_2) {
    return UVar19;
  }
  operator_delete(header.d._M_dataplus._M_p);
  return UVar19;
}

Assistant:

USTATUS FfsParser::parseBpdtRegion(const UByteArray & region, const UINT32 localOffset, const UINT32 sbpdtOffsetFixup, const UModelIndex & parent, UModelIndex & index)
{
    UINT32 regionSize = (UINT32)region.size();
    
    // Check region size
    if (regionSize < sizeof(BPDT_HEADER)) {
        msg(usprintf("%s: BPDT region too small to fit BPDT partition table header", __FUNCTION__), parent);
        return U_INVALID_ME_PARTITION_TABLE;
    }
    
    // Populate partition table header
    const BPDT_HEADER* ptHeader = (const BPDT_HEADER*)(region.constData());
    
    // Check region size again
    UINT32 ptBodySize = ptHeader->NumEntries * sizeof(BPDT_ENTRY);
    UINT32 ptSize = sizeof(BPDT_HEADER) + ptBodySize;
    if (regionSize < ptSize) {
        msg(usprintf("%s: BPDT region too small to fit BPDT partition table", __FUNCTION__), parent);
        return U_INVALID_ME_PARTITION_TABLE;
    }
    
    // Get info
    UByteArray header = region.left(sizeof(BPDT_HEADER));
    UByteArray body = region.mid(sizeof(BPDT_HEADER), ptBodySize);
    
    UString name = UString("BPDT partition table");
    UString info = usprintf("Full size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\n"
                            "Number of entries: %u\nVersion: %02Xh\nRedundancyFlag: %Xh\n"
                            "IFWI version: %Xh\nFITC version: %u.%u.%u.%u",
                            ptSize, ptSize,
                            (UINT32)header.size(), (UINT32)header.size(),
                            ptBodySize, ptBodySize,
                            ptHeader->NumEntries,
                            ptHeader->HeaderVersion,
                            ptHeader->RedundancyFlag,
                            ptHeader->IfwiVersion,
                            ptHeader->FitcMajor, ptHeader->FitcMinor, ptHeader->FitcHotfix, ptHeader->FitcBuild);
    
    // Add tree item
    index = model->addItem(localOffset, Types::BpdtStore, 0, name, UString(), info, header, body, UByteArray(), Fixed, parent);
    
    // Adjust offset
    UINT32 offset = sizeof(BPDT_HEADER);
    
    // Add partition table entries
    std::vector<BPDT_PARTITION_INFO> partitions;
    const BPDT_ENTRY* firstPtEntry = (const BPDT_ENTRY*)((const UINT8*)ptHeader + sizeof(BPDT_HEADER));
    UINT16 numEntries = ptHeader->NumEntries;
    for (UINT16 i = 0; i < numEntries; i++) {
        // Populate entry header
        const BPDT_ENTRY* ptEntry = firstPtEntry + i;
        
        // Get info
        name = bpdtEntryTypeToUString(ptEntry->Type);
        info = usprintf("Full size: %Xh (%u)\nType: %Xh\nPartition offset: %Xh\nPartition length: %Xh",
                        (UINT32)sizeof(BPDT_ENTRY), (UINT32)sizeof(BPDT_ENTRY),
                        ptEntry->Type,
                        ptEntry->Offset,
                        ptEntry->Size) +
        UString("\nSplit sub-partition first part: ") + (ptEntry->SplitSubPartitionFirstPart ? "Yes" : "No") +
        UString("\nSplit sub-partition second part: ") + (ptEntry->SplitSubPartitionSecondPart ? "Yes" : "No") +
        UString("\nCode sub-partition: ") + (ptEntry->CodeSubPartition ? "Yes" : "No") +
        UString("\nUMA cacheable: ") + (ptEntry->UmaCacheable ? "Yes" : "No");
        
        // Add tree item
        UModelIndex entryIndex = model->addItem(localOffset + offset, Types::BpdtEntry, 0, name, UString(), info, UByteArray(), UByteArray((const char*)ptEntry, sizeof(BPDT_ENTRY)), UByteArray(), Fixed, index);
        
        // Adjust offset
        offset += sizeof(BPDT_ENTRY);
        
        if (ptEntry->Offset != 0 && ptEntry->Offset != 0xFFFFFFFF && ptEntry->Size != 0) {
            // Add to partitions vector
            BPDT_PARTITION_INFO partition = {};
            partition.type = Types::BpdtPartition;
            partition.ptEntry = *ptEntry;
            partition.ptEntry.Offset -= sbpdtOffsetFixup;
            partition.index = entryIndex;
            partitions.push_back(partition);
        }
    }
    
    // Check for empty set of partitions
    if (partitions.empty()) {
        // Add a single padding partition in this case
        BPDT_PARTITION_INFO padding = {};
        padding.ptEntry.Offset = offset;
        padding.ptEntry.Size = (UINT32)(region.size() - padding.ptEntry.Offset);
        padding.type = Types::Padding;
        partitions.push_back(padding);
    }
    
make_partition_table_consistent:
    if (partitions.empty()) {
        return U_INVALID_ME_PARTITION_TABLE;
    }
    // Sort partitions by offset
    std::sort(partitions.begin(), partitions.end());
    
    // Check for intersections and paddings between partitions
    BPDT_PARTITION_INFO padding = {};
    
    // Check intersection with the partition table header
    if (partitions.front().ptEntry.Offset < ptSize) {
        msg(usprintf("%s: BPDT partition has intersection with BPDT partition table, skipped", __FUNCTION__),
            partitions.front().index);
        partitions.erase(partitions.begin());
        goto make_partition_table_consistent;
    }
    // Check for padding between partition table and the first partition
    else if (partitions.front().ptEntry.Offset > ptSize) {
        padding.ptEntry.Offset = ptSize;
        padding.ptEntry.Size = partitions.front().ptEntry.Offset - padding.ptEntry.Offset;
        padding.type = Types::Padding;
        partitions.insert(partitions.begin(), padding);
    }
    // Check for intersections/paddings between partitions
    for (size_t i = 1; i < partitions.size(); i++) {
        UINT32 previousPartitionEnd = partitions[i - 1].ptEntry.Offset + partitions[i - 1].ptEntry.Size;
        
        // Check that partition is fully present in the image
        if ((UINT64)partitions[i].ptEntry.Offset + (UINT64)partitions[i].ptEntry.Size > regionSize) {
            if ((UINT64)partitions[i].ptEntry.Offset >= (UINT64)region.size()) {
                msg(usprintf("%s: BPDT partition is located outside of the opened image, skipped", __FUNCTION__), partitions[i].index);
                partitions.erase(partitions.begin() + i);
                goto make_partition_table_consistent;
            }
            else {
                msg(usprintf("%s: BPDT partition can't fit into its region, truncated", __FUNCTION__), partitions[i].index);
                partitions[i].ptEntry.Size = regionSize - (UINT32)partitions[i].ptEntry.Offset;
            }
        }
        
        // Check for intersection with previous partition
        if (partitions[i].ptEntry.Offset < previousPartitionEnd) {
            // Check if current partition is located inside previous one
            if (partitions[i].ptEntry.Offset + partitions[i].ptEntry.Size <= previousPartitionEnd) {
                msg(usprintf("%s: BPDT partition is located inside another BPDT partition, skipped", __FUNCTION__),
                    partitions[i].index);
                partitions.erase(partitions.begin() + i);
                goto make_partition_table_consistent;
            }
            else {
                msg(usprintf("%s: BPDT partition intersects with previous one, skipped", __FUNCTION__),
                    partitions[i].index);
                partitions.erase(partitions.begin() + i);
                goto make_partition_table_consistent;
            }
        }
        
        // Check for padding between current and previous partitions
        else if (partitions[i].ptEntry.Offset > previousPartitionEnd) {
            padding.ptEntry.Offset = previousPartitionEnd;
            padding.ptEntry.Size = partitions[i].ptEntry.Offset - previousPartitionEnd;
            padding.type = Types::Padding;
            std::vector<BPDT_PARTITION_INFO>::iterator iter = partitions.begin();
            std::advance(iter, i);
            partitions.insert(iter, padding);
        }
    }
    
    // Partition map is consistent
    for (size_t i = 0; i < partitions.size(); i++) {
        if (partitions[i].type == Types::BpdtPartition) {
            // Get info
            UString name = bpdtEntryTypeToUString(partitions[i].ptEntry.Type);
            UByteArray partition = region.mid(partitions[i].ptEntry.Offset, partitions[i].ptEntry.Size);
            UByteArray signature = partition.left(sizeof(UINT32));
            
            UString info = usprintf("Full size: %Xh (%u)\nType: %Xh",
                                    (UINT32)partition.size(), (UINT32)partition.size(),
                                    partitions[i].ptEntry.Type) +
            UString("\nSplit sub-partition first part: ") + (partitions[i].ptEntry.SplitSubPartitionFirstPart ? "Yes" : "No") +
            UString("\nSplit sub-partition second part: ") + (partitions[i].ptEntry.SplitSubPartitionSecondPart ? "Yes" : "No") +
            UString("\nCode sub-partition: ") + (partitions[i].ptEntry.CodeSubPartition ? "Yes" : "No") +
            UString("\nUMA cacheable: ") + (partitions[i].ptEntry.UmaCacheable ? "Yes" : "No");
            
            UString text = bpdtEntryTypeToUString(partitions[i].ptEntry.Type);
            
            // Add tree item
            UModelIndex partitionIndex = model->addItem(localOffset + partitions[i].ptEntry.Offset, Types::BpdtPartition, 0, name, text, info, UByteArray(), partition, UByteArray(), Fixed, parent);
            
            // Special case of S-BPDT
            if (partitions[i].ptEntry.Type == BPDT_ENTRY_TYPE_S_BPDT) {
                UModelIndex sbpdtIndex;
                parseBpdtRegion(partition, 0, partitions[i].ptEntry.Offset, partitionIndex, sbpdtIndex); // Third parameter is a fixup for S-BPDT offset entries, because they are calculated from the start of BIOS region
            }
            
            // Parse code partitions
            if (readUnaligned((const UINT32*)partition.constData()) == CPD_SIGNATURE) {
                // Parse code partition contents
                UModelIndex cpdIndex;
                parseCpdRegion(partition, 0, partitionIndex, cpdIndex);
            }
            
            // Check for entry type to be known
            if (partitions[i].ptEntry.Type > BPDT_ENTRY_TYPE_PSEP) {
                msg(usprintf("%s: BPDT entry of unknown type found", __FUNCTION__), partitionIndex);
            }
        }
        else if (partitions[i].type == Types::Padding) {
            UByteArray padding = region.mid(partitions[i].ptEntry.Offset, partitions[i].ptEntry.Size);
            
            // Get info
            name = UString("Padding");
            info = usprintf("Full size: %Xh (%u)",
                            (UINT32)padding.size(), (UINT32)padding.size());
            
            // Add tree item
            model->addItem(localOffset + partitions[i].ptEntry.Offset, Types::Padding, getPaddingType(padding), name, UString(), info, UByteArray(), padding, UByteArray(), Fixed, parent);
        }
    }
    
    // Add padding after the last region
    if ((UINT64)partitions.back().ptEntry.Offset + (UINT64)partitions.back().ptEntry.Size < regionSize) {
        UINT64 usedSize = (UINT64)partitions.back().ptEntry.Offset + (UINT64)partitions.back().ptEntry.Size;
        UByteArray padding = region.mid(partitions.back().ptEntry.Offset + partitions.back().ptEntry.Size, (int)(regionSize - usedSize));
        
        // Get info
        name = UString("Padding");
        info = usprintf("Full size: %Xh (%u)",
                        (UINT32)padding.size(), (UINT32)padding.size());
        
        // Add tree item
        model->addItem(localOffset + partitions.back().ptEntry.Offset + partitions.back().ptEntry.Size, Types::Padding, getPaddingType(padding), name, UString(), info, UByteArray(), padding, UByteArray(), Fixed, parent);
    }
    
    return U_SUCCESS;
}